

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorder.hpp
# Opt level: O0

void MGARD::data_reorder_3D<float>
               (float *data_pos,float *data_buffer,size_t n1,size_t n2,size_t n3,size_t dim0_stride,
               size_t dim1_stride)

{
  float fVar1;
  float *data_buffer_00;
  size_t n1_00;
  size_t n2_00;
  size_t stride;
  float *in_RCX;
  ulong in_RDX;
  long in_RDI;
  float *in_R8;
  float *in_R9;
  int j_1;
  int k;
  int j;
  int i;
  float *cur_data_pos;
  size_t n3_coeff;
  size_t n3_nodal;
  size_t n2_coeff;
  size_t n2_nodal;
  size_t n1_coeff;
  size_t n1_nodal;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  
  data_buffer_00 = (float *)((in_RDX >> 1) + 1);
  n1_00 = in_RDX - (long)data_buffer_00;
  n2_00 = ((ulong)in_RCX >> 1) + 1;
  stride = (long)in_RCX - n2_00;
  local_68 = in_RDI;
  for (local_6c = 0; (ulong)(long)local_6c < in_RDX; local_6c = local_6c + 1) {
    data_reorder_2D<float>(in_RCX,in_R8,(size_t)in_R9,(size_t)data_buffer_00,n1_00);
    local_68 = (long)in_R9 * 4 + local_68;
  }
  if ((in_RDX & 1) == 0) {
    local_68 = local_68 + (long)in_R9 * -4;
    for (local_70 = 0; (float *)(long)local_70 < in_RCX; local_70 = local_70 + 1) {
      for (local_74 = 0; (float *)(long)local_74 < in_R8; local_74 = local_74 + 1) {
        fVar1 = *(float *)(local_68 + (long)local_74 * 4);
        *(float *)(local_68 + (long)local_74 * 4) =
             fVar1 + fVar1 + -*(float *)(local_68 + ((long)local_74 - (long)in_R9) * 4);
      }
      local_68 = _j * 4 + local_68;
    }
  }
  for (local_78 = 0; (float *)(long)local_78 < in_RCX; local_78 = local_78 + 1) {
    switch_rows_2D_by_buffer<float>(in_R9,data_buffer_00,n1_00,n2_00,stride);
  }
  return;
}

Assistant:

void data_reorder_3D(T * data_pos, T * data_buffer, size_t n1, size_t n2, size_t n3, size_t dim0_stride, size_t dim1_stride){
    size_t n1_nodal = (n1 >> 1) + 1;
    size_t n1_coeff = n1 - n1_nodal;
    size_t n2_nodal = (n2 >> 1) + 1;
    size_t n2_coeff = n2 - n2_nodal;
    size_t n3_nodal = (n3 >> 1) + 1;
    size_t n3_coeff = n3 - n3_nodal;
    T * cur_data_pos = data_pos;
    // do 2D reorder
    for(int i=0; i<n1; i++){
        data_reorder_2D(cur_data_pos, data_buffer, n2, n3, dim1_stride);
        cur_data_pos += dim0_stride;
    }
    if(!(n1 & 1)){
        // n1 is even, change the last coeff plane into nodal plane
        cur_data_pos -= dim0_stride;
        for(int j=0; j<n2; j++){
            for(int k=0; k<n3; k++){
                cur_data_pos[k] = 2 * cur_data_pos[k] - cur_data_pos[- dim0_stride + k];
            }
            cur_data_pos += dim1_stride;
        }
    }
    cur_data_pos = data_pos;
    // reorder vertically
    for(int j=0; j<n2; j++){
        switch_rows_2D_by_buffer(cur_data_pos, data_buffer, n1, n3, dim0_stride);
        cur_data_pos += dim1_stride;
    }
}